

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int64_t iVar4;
  uint64_t uVar5;
  ulong uVar6;
  int iVar7;
  __shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2> local_158;
  _Storage<long,_true> local_148;
  undefined1 local_140;
  int64_t local_138;
  undefined1 local_130;
  int64_t local_128;
  undefined1 local_120;
  int64_t local_118;
  undefined1 local_110;
  uint64_t local_108;
  char local_100;
  int local_f8;
  undefined4 local_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined1 local_e4;
  undefined4 local_e0;
  undefined1 local_dc;
  filehandle f;
  char *local_c8;
  shared_ptr<mappedmem> mmem;
  char *local_98;
  string srcFilename;
  long local_60;
  long local_58;
  string dstFilename;
  
  srcFilename._M_dataplus._M_p = (pointer)&srcFilename.field_2;
  srcFilename._M_string_length = 0;
  dstFilename._M_dataplus._M_p = (pointer)&dstFilename.field_2;
  dstFilename._M_string_length = 0;
  srcFilename.field_2._M_local_buf[0] = '\0';
  dstFilename.field_2._M_local_buf[0] = '\0';
  local_140 = 0;
  local_130 = 0;
  local_120 = 0;
  local_110 = 0;
  local_100 = '\0';
  local_f8 = 1;
  local_f4 = 0;
  uStack_f0 = 0;
  uStack_ec = 0;
  uStack_e8 = 0;
  local_e4 = 1;
  local_dc = 0;
  local_158._M_ptr = (element_type *)CONCAT44(local_158._M_ptr._4_4_,argc);
  local_158._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  ArgParser::begin((ArgIterator *)&f,(ArgParser *)&local_158);
  ArgParser::end((ArgIterator *)&mmem,(ArgParser *)&local_158);
  bVar1 = false;
  iVar7 = 0;
  iVar4 = 0;
  while( true ) {
    if ((f._p.super___shared_ptr<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _4_4_ == mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                  _4_4_) && (local_c8 == local_98)) break;
    iVar2 = ArgParser::ArgIterator::option((ArgIterator *)&f);
    switch(iVar2) {
    case 0x65:
      local_138 = ArgParser::ArgIterator::getint((ArgIterator *)&f);
      local_130 = 1;
      break;
    case 0x66:
      local_e4 = 0;
      break;
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
    case 0x76:
      goto switchD_00103542_caseD_67;
    case 0x6c:
      local_128 = ArgParser::ArgIterator::getint((ArgIterator *)&f);
      local_120 = 1;
      break;
    case 0x6f:
      local_148._M_value = ArgParser::ArgIterator::getint((ArgIterator *)&f);
      local_140 = 1;
      break;
    case 0x70:
      iVar4 = ArgParser::ArgIterator::getint((ArgIterator *)&f);
      break;
    case 0x73:
      uVar5 = ArgParser::ArgIterator::getuint((ArgIterator *)&f);
      uStack_f0 = (undefined4)uVar5;
      uStack_ec = (undefined4)(uVar5 >> 0x20);
      break;
    case 0x77:
      uVar5 = ArgParser::ArgIterator::getuint((ArgIterator *)&f);
      local_f4 = (undefined4)uVar5;
      break;
    case 0x78:
      iVar2 = ArgParser::ArgIterator::count((ArgIterator *)&f);
      if (iVar2 == 2) {
        uStack_e8 = 2;
      }
      else {
        uStack_e8 = 1;
      }
      break;
    default:
      uVar6 = (ulong)(iVar2 - 0x31U);
      if (iVar2 - 0x31U < 0x32) {
        if ((0x8bUL >> (uVar6 & 0x3f) & 1) == 0) {
          if (uVar6 == 0x22) {
            uVar5 = ArgParser::ArgIterator::getuint((ArgIterator *)&f);
            if (!bVar1) {
              local_dc = 1;
              bVar1 = true;
            }
            local_e0 = (undefined4)uVar5;
          }
          else {
            if (uVar6 != 0x31) goto LAB_001035a4;
            local_118 = ArgParser::ArgIterator::getint((ArgIterator *)&f);
            local_110 = 1;
          }
        }
        else {
          local_f8 = ArgParser::ArgIterator::option((ArgIterator *)&f);
          local_f8 = local_f8 + -0x30;
        }
      }
      else {
LAB_001035a4:
        if (iVar2 != -1) goto switchD_00103542_caseD_67;
        if (iVar7 == 1) {
          pcVar3 = ArgParser::ArgIterator::getstr((ArgIterator *)&f);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&dstFilename,pcVar3);
          iVar7 = 2;
        }
        else if (iVar7 == 0) {
          pcVar3 = ArgParser::ArgIterator::getstr((ArgIterator *)&f);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&srcFilename,pcVar3);
          iVar7 = 1;
        }
        else {
          iVar7 = iVar7 + 1;
        }
      }
    }
    ArgParser::ArgIterator::operator++((ArgIterator *)&f);
  }
  if (((int)iVar4 != 0) || (iVar7 != 0 && iVar7 < 3)) {
    DumpParams::resolveLineFormat((DumpParams *)&local_148);
    f._p.super___shared_ptr<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    f._p.super___shared_ptr<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (srcFilename._M_string_length == 0) {
LAB_001037b0:
      DumpParams::applyFormat((DumpParams *)&local_148,(ostream *)&std::cout);
      if (mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        puts("Nothing to do");
        goto LAB_00103803;
      }
      local_158._M_ptr =
           (element_type *)
           ((mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pmem +
           (mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->dataofs);
      local_158._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(local_158._M_ptr)->pmem + local_128);
      Hex::operator<<((ostream *)&std::cout,(Hexdumper<unsigned_char> *)&local_158);
      iVar7 = 0;
    }
    else {
      iVar7 = open(srcFilename._M_dataplus._M_p,0);
      filehandle::operator=(&f,iVar7);
      local_108 = filehandle::size(&f);
      if (local_100 == '\0') {
        local_100 = '\x01';
      }
      bVar1 = DumpParams::resolveSizes((DumpParams *)&local_148);
      if (bVar1) {
        local_58 = local_148._M_value - local_118;
        local_60 = local_138 - local_118;
        std::make_shared<mappedmem,filehandle&,long,long,int>
                  ((filehandle *)&local_158,(long *)&f,&local_58,(int *)&local_60);
        std::__shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>,&local_158);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
        goto LAB_001037b0;
      }
LAB_00103803:
      iVar7 = 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mmem.super___shared_ptr<mappedmem,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f._p.super___shared_ptr<filehandle::ptr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    goto LAB_00103820;
  }
switchD_00103542_caseD_67:
  usage();
  iVar7 = 1;
LAB_00103820:
  std::__cxx11::string::~string((string *)&dstFilename);
  std::__cxx11::string::~string((string *)&srcFilename);
  return iVar7;
}

Assistant:

int main(int argc, char**argv)
{
    std::string srcFilename;
    std::string dstFilename;
    DumpParams params;
    int processId = 0;

    int argsfound = 0; 
    for (auto& arg : ArgParser(argc, argv))
        switch(arg.option())
        {
          // options from 'dump', not yet implemented:
          //   -h  : dump hashes
          //   -ripemd160
          //   -sha1, -sha2, -sha3, -sha5, -sum
          //   -md5, -md2, -md4, -md160
          //   -a : strings
          //   -crc
          //   -c : raw selected data to stdout.
          //   -r SIZE  : specify readchunk
          //
          // todo: add choice of reading via stdio, or via mmap
          // todo: add choice of outputting a hexdump, rawdata, stringdump, to dstFilename

            case 'b': params.baseOffset = arg.getint(); break;  // the offset at file pos 0
            case 'o': params.offset = arg.getint(); break;
            case 'e': params.endOffset = arg.getint(); break;
            case 'l': params.length = arg.getint(); break;
            case 'p': processId = arg.getint(); break;

            case 'w': params.unitsPerLine = arg.getuint(); break;
            case 's': params.stepSize = arg.getuint(); break;
            case 'f': params.summarize = false; break;
            case 'S': params.summarizeThreshold = arg.getuint(); break;
            case 'x': if (arg.count()==2)
                          params.dumpformat = DUMP_ASCII; 
                      else
                          params.dumpformat = DUMP_HEX; 
                      break;
            case '1': case '2': case '4': case '8':
                params.dumpUnitSize = arg.option()-'0';
                break;

            case -1:
                switch (argsfound++) {
                    case 0: srcFilename = arg.getstr(); break;
                    case 1: dstFilename = arg.getstr(); break;
                }
                break;

            default:
                usage();
                return 1;
        }

    if (processId==0 && (argsfound==0 || argsfound>2))
    {
        usage();
        return 1;
    }

    params.resolveLineFormat();

    filehandle f;
#ifdef __MACH__
    std::shared_ptr<MachVirtualMemory> vmem;
#endif
    std::shared_ptr<mappedmem> mmem;

    if (!srcFilename.empty()) {
        f = open(srcFilename.c_str(), O_RDONLY);
        params.fileSize = f.size();

        if (!params.resolveSizes())
            return 1;
        mmem = std::make_shared<mappedmem>(f, *params.offset - *params.baseOffset, *params.endOffset - *params.baseOffset, PROT_READ);
    }
#ifdef __MACH__
    else if (processId) {
        try {
        task_t task = MachOpenProcessByPid(processId);
        vmem = std::make_shared<MachVirtualMemory>(task, *params.offset, *params.length);
        }
        catch(std::exception& e)
        {
            std::cout << "ERROR " << e.what() << "\n";
        }
    }
#endif

    params.applyFormat(std::cout);

    if (mmem)
        std::cout << Hex::dumper(mmem->data(), mmem->data()+*params.length);
#ifdef __MACH__
    else if (vmem)
        std::cout << Hex::dumper(vmem->begin(), vmem->end());
#endif
    else {
        printf("Nothing to do\n");
        return 1;
    }